

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

SBuf * lj_buf_puttab(SBuf *sb,GCtab *t,GCstr *sep,int32_t i,int32_t e)

{
  uint uVar1;
  SBuf *pSVar2;
  uint in_ECX;
  long in_RDX;
  GCtab *in_RSI;
  SBuf *in_RDI;
  uint in_R8D;
  MSize len;
  char *p;
  cTValue *o;
  MSize seplen;
  MSize in_stack_ffffffffffffff3c;
  SBuf *in_stack_ffffffffffffff40;
  cTValue *local_b0;
  uint local_a8;
  SBuf *local_a0;
  uint local_84;
  SBuf *local_50;
  char *local_38;
  
  if (in_RDX == 0) {
    local_a8 = 0;
  }
  else {
    local_a8 = *(uint *)(in_RDX + 0xc);
  }
  local_84 = in_ECX;
  if ((int)in_R8D < (int)in_ECX) {
    return in_RDI;
  }
  while( true ) {
    if (local_84 < in_RSI->asize) {
      local_b0 = (cTValue *)((ulong)(in_RSI->array).ptr32 + (long)(int)local_84 * 8);
    }
    else {
      local_b0 = lj_tab_getinth(in_RSI,local_84);
    }
    if (local_b0 == (cTValue *)0x0) break;
    if ((local_b0->field_2).it == 0xfffffffb) {
      uVar1 = *(uint *)((ulong)(local_b0->u32).lo + 0xc);
      if ((in_RDI->e).ptr32 - (in_RDI->p).ptr32 < uVar1 + local_a8) {
        local_38 = lj_buf_more2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      }
      else {
        local_38 = (char *)(ulong)(in_RDI->p).ptr32;
      }
      memcpy(local_38,(void *)((ulong)(local_b0->u32).lo + 0x10),(ulong)uVar1);
      local_a0 = (SBuf *)(local_38 + uVar1);
    }
    else {
      if (0xfffefffe < (local_b0->field_2).it) break;
      pSVar2 = lj_strfmt_putfnum(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                                 7.89551486649521e-318);
      if ((pSVar2->e).ptr32 - (pSVar2->p).ptr32 < local_a8) {
        local_50 = (SBuf *)lj_buf_more2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      }
      else {
        local_50 = (SBuf *)(ulong)(pSVar2->p).ptr32;
      }
      local_a0 = local_50;
    }
    if (local_84 == in_R8D) {
      (in_RDI->p).ptr32 = (uint32_t)local_a0;
      return in_RDI;
    }
    if (local_a8 != 0) {
      memcpy(local_a0,(void *)(in_RDX + 0x10),(ulong)local_a8);
      in_stack_ffffffffffffff40 = local_a0;
      local_a0 = (SBuf *)((long)&(local_a0->p).ptr32 + (ulong)local_a8);
    }
    (in_RDI->p).ptr32 = (uint32_t)local_a0;
    local_84 = local_84 + 1;
  }
  (in_RDI->p).ptr32 = local_84;
  return (SBuf *)0x0;
}

Assistant:

SBuf *lj_buf_puttab(SBuf *sb, GCtab *t, GCstr *sep, int32_t i, int32_t e)
{
  MSize seplen = sep ? sep->len : 0;
  if (i <= e) {
    for (;;) {
      cTValue *o = lj_tab_getint(t, i);
      char *p;
      if (!o) {
      badtype:  /* Error: bad element type. */
	setsbufP(sb, (void *)(intptr_t)i);  /* Store failing index. */
	return NULL;
      } else if (tvisstr(o)) {
	MSize len = strV(o)->len;
	p = lj_buf_wmem(lj_buf_more(sb, len + seplen), strVdata(o), len);
      } else if (tvisint(o)) {
	p = lj_strfmt_wint(lj_buf_more(sb, STRFMT_MAXBUF_INT+seplen), intV(o));
      } else if (tvisnum(o)) {
	p = lj_buf_more(lj_strfmt_putfnum(sb, STRFMT_G14, numV(o)), seplen);
      } else {
	goto badtype;
      }
      if (i++ == e) {
	setsbufP(sb, p);
	break;
      }
      if (seplen) p = lj_buf_wmem(p, strdata(sep), seplen);
      setsbufP(sb, p);
    }
  }
  return sb;
}